

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O0

string * brynet::net::WebSocketFormat::wsHandshake(string *__return_storage_ptr__,string *secKey)

{
  uint len;
  uchar *data;
  allocator<char> local_12a;
  undefined1 local_129;
  undefined1 local_128 [8];
  string base64Str;
  uchar puDest [20];
  undefined1 local_e0 [8];
  CSHA1 s1;
  string *secKey_local;
  string *response;
  
  s1.m_block = (SHA1_WORKSPACE_BLOCK *)secKey;
  std::__cxx11::string::append((char *)secKey);
  CSHA1::CSHA1((CSHA1 *)local_e0);
  data = (uchar *)std::__cxx11::string::c_str();
  len = std::__cxx11::string::size();
  CSHA1::Update((CSHA1 *)local_e0,data,len);
  CSHA1::Final((CSHA1 *)local_e0);
  CSHA1::GetHash((CSHA1 *)local_e0,(uchar *)(base64Str.field_2._M_local_buf + 8));
  base64_encode_abi_cxx11_((string *)local_128,(uchar *)(base64Str.field_2._M_local_buf + 8),0x14);
  local_129 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
             ,&local_12a);
  std::allocator<char>::~allocator(&local_12a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_128);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n\r\n");
  local_129 = 1;
  std::__cxx11::string::~string((string *)local_128);
  CSHA1::~CSHA1((CSHA1 *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

static std::string wsHandshake(std::string secKey)
            {
                secKey.append("258EAFA5-E914-47DA-95CA-C5AB0DC85B11");

                CSHA1 s1;
                s1.Update((unsigned char*)secKey.c_str(), static_cast<unsigned int>(secKey.size()));
                s1.Final();
                unsigned char puDest[20];
                s1.GetHash(puDest);

                std::string base64Str = base64_encode((const unsigned char *)puDest, 20);

                std::string response = "HTTP/1.1 101 Switching Protocols\r\n"
                    "Upgrade: websocket\r\n"
                    "Connection: Upgrade\r\n"
                    "Sec-WebSocket-Accept: ";

                response += base64Str;
                response += "\r\n\r\n";

                return response;
            }